

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::setCursor(QGraphicsItem *this,QCursor *cursor)

{
  bool bVar1;
  QGraphicsItemPrivate *point;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsScenePrivate *pQVar3;
  QGraphicsView **ppQVar4;
  ulong uVar5;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *itemUnderCursor;
  QList<QGraphicsItem_*> *__range5;
  QGraphicsView *view;
  QList<QGraphicsView_*> *__range2;
  const_iterator __end5;
  const_iterator __begin5;
  QList<QGraphicsItem_*> itemsUnderCursor;
  QPointF cursorPos;
  QPoint viewPoint;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QGraphicsView_*> views;
  QVariant cursorVariant;
  undefined1 in_stack_fffffffffffffe3f;
  QWidget *in_stack_fffffffffffffe40;
  QVariant *this_00;
  QPoint *in_stack_fffffffffffffe48;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  QWidget *in_stack_fffffffffffffe50;
  QMetaMethodArgument *this_02;
  QVariant *in_stack_fffffffffffffe58;
  QMetaMethodArgument *arguments;
  QGraphicsItemPrivate *in_stack_fffffffffffffe70;
  QGraphicsView *in_stack_fffffffffffffe78;
  QCursor local_160 [4];
  QGraphicsItem **local_140;
  const_iterator local_138;
  const_iterator local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 local_110 [32];
  QPointF local_f0;
  QPointF local_e0;
  undefined8 local_d0;
  QPoint local_c8;
  QGraphicsView **local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  QCursor local_90;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::fromValue<QCursor>((QCursor *)in_stack_fffffffffffffe48);
  (**(code **)(*(long *)&(((QAbstractScrollArea *)&in_RDI->_vptr_QGraphicsItem)->super_QFrame).
                         super_QWidget + 0x108))(&local_28,in_RDI,0x11,&local_48);
  ::QVariant::~QVariant(&local_48);
  point = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
          operator->(&in_RDI->d_ptr);
  qvariant_cast<QCursor>(in_stack_fffffffffffffe58);
  QCursor::operator_cast_to_QVariant((QCursor *)&local_68);
  QGraphicsItemPrivate::setExtra
            (in_stack_fffffffffffffe70,(Extra)((ulong)in_RDI >> 0x20),(QVariant *)point);
  ::QVariant::~QVariant(&local_68);
  QCursor::~QCursor(&local_90);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI->d_ptr);
  *(ulong *)&pQVar2->field_0x160 = *(ulong *)&pQVar2->field_0x160 & 0xffffffffffff7fff | 0x8000;
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI->d_ptr);
  if (pQVar2->scene == (QGraphicsScene *)0x0) goto LAB_0097af2f;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            (&in_RDI->d_ptr);
  pQVar3 = QGraphicsScene::d_func((QGraphicsScene *)0x97ab9c);
  *(uint *)&pQVar3->field_0xb8 = *(uint *)&pQVar3->field_0xb8 & 0xffffdfff;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            (&in_RDI->d_ptr);
  QGraphicsScene::views((QGraphicsScene *)in_stack_fffffffffffffe48);
  local_b0.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
  local_b0 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_stack_fffffffffffffe40);
  local_b8.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
  local_b8 = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_stack_fffffffffffffe40);
  while( true ) {
    local_c0 = local_b8.i;
    bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_b0,local_b8);
    if (!bVar1) break;
    ppQVar4 = QList<QGraphicsView_*>::const_iterator::operator*(&local_b0);
    this_02 = (QMetaMethodArgument *)*ppQVar4;
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe40);
    QWidget::setMouseTracking(in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f);
    bVar1 = QWidget::underMouse((QWidget *)0x97acc2);
    if (bVar1) {
      local_c8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      arguments = this_02;
      local_d0 = QCursor::pos();
      local_c8 = QWidget::mapFromGlobal(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_e0.yp = -NAN;
      local_e0.xp = -NAN;
      local_f0 = QGraphicsView::mapToScene((QGraphicsView *)in_RDI,(QPoint *)point);
      local_e0 = mapFromScene(in_RDI,(QPointF *)point);
      (**(code **)(*(long *)&(((QAbstractScrollArea *)&in_RDI->_vptr_QGraphicsItem)->super_QFrame).
                             super_QWidget + 0x18))(local_110);
      uVar5 = QRectF::contains((QPointF *)local_110);
      if ((uVar5 & 1) != 0) {
        local_128 = &DAT_aaaaaaaaaaaaaaaa;
        local_120 = &DAT_aaaaaaaaaaaaaaaa;
        local_118 = &DAT_aaaaaaaaaaaaaaaa;
        QGraphicsView::items(in_stack_fffffffffffffe78,(QPoint *)in_stack_fffffffffffffe70);
        local_130.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
        local_130 = QList<QGraphicsItem_*>::begin
                              ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffe40);
        local_138.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
        local_138 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffffe40)
        ;
        goto LAB_0097ae47;
      }
      break;
    }
    QList<QGraphicsView_*>::const_iterator::operator++(&local_b0);
  }
  goto LAB_0097af22;
LAB_0097ae47:
  local_140 = local_138.i;
  bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_130,local_138);
  if (!bVar1) goto LAB_0097aeff;
  QList<QGraphicsItem_*>::const_iterator::operator*(&local_130);
  bVar1 = hasCursor((QGraphicsItem *)0x97ae94);
  if (bVar1) {
    QGraphicsItem::cursor((QGraphicsItem *)this_02);
    QtPrivate::Invoke::argument<QCursor>((char *)this_02,(QCursor *)in_stack_fffffffffffffe48);
    QMetaObject::invokeMethod<QMetaMethodArgument>((QObject *)in_RDI,(char *)point,arguments);
    QCursor::~QCursor(local_160);
    goto LAB_0097aeff;
  }
  QList<QGraphicsItem_*>::const_iterator::operator++(&local_130);
  goto LAB_0097ae47;
LAB_0097aeff:
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x97af0c);
LAB_0097af22:
  QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x97af2f);
LAB_0097af2f:
  this_00 = &local_88;
  this_01 = &local_28;
  (**(code **)(*(long *)&(((QAbstractScrollArea *)&in_RDI->_vptr_QGraphicsItem)->super_QFrame).
                         super_QWidget + 0x108))(this_00,in_RDI,0x12);
  ::QVariant::~QVariant(this_00);
  ::QVariant::~QVariant((QVariant *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::setCursor(const QCursor &cursor)
{
    const QVariant cursorVariant(itemChange(ItemCursorChange, QVariant::fromValue<QCursor>(cursor)));
    d_ptr->setExtra(QGraphicsItemPrivate::ExtraCursor, qvariant_cast<QCursor>(cursorVariant));
    d_ptr->hasCursor = 1;
    if (d_ptr->scene) {
        d_ptr->scene->d_func()->allItemsUseDefaultCursor = false;
        const auto views = d_ptr->scene->views();
        for (QGraphicsView *view : views) {
            view->viewport()->setMouseTracking(true);
            // Note: Some of this logic is duplicated in QGraphicsView's mouse events.
            if (view->underMouse()) {
                const QPoint viewPoint = view->mapFromGlobal(QCursor::pos());
                const QPointF cursorPos = mapFromScene(view->mapToScene(viewPoint));
                // the cursor can only change if the current item is under the mouse
                if (boundingRect().contains(cursorPos)) {
                    const auto itemsUnderCursor = view->items(viewPoint);
                    for (QGraphicsItem *itemUnderCursor : itemsUnderCursor) {
                        if (itemUnderCursor->hasCursor()) {
                            QMetaObject::invokeMethod(view, "_q_setViewportCursor",
                                                      Q_ARG(QCursor, itemUnderCursor->cursor()));
                            break;
                        }
                    }
                }
                break;
            }
        }
    }
    itemChange(ItemCursorHasChanged, cursorVariant);
}